

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void Commands::ReloadPub(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Command_Source *from)

{
  pointer pbVar1;
  int iVar2;
  undefined4 extraout_var;
  bool quiet;
  long *local_40 [2];
  long local_30 [2];
  
  (*from->_vptr_Command_Source[2])(local_40);
  Console::Out("Pub files reloaded by %s",local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pbVar1 = (arguments->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar1) {
    quiet = true;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)pbVar1);
    quiet = iVar2 != 0;
  }
  iVar2 = (*from->_vptr_Command_Source[4])(from);
  World::ReloadPub((World *)CONCAT44(extraout_var,iVar2),quiet);
  return;
}

Assistant:

void ReloadPub(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	Console::Out("Pub files reloaded by %s", from->SourceName().c_str());

	bool quiet = true;

	if (arguments.size() >= 1)
		quiet = (arguments[0] != "announce");

	from->SourceWorld()->ReloadPub(quiet);
}